

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O2

void __thiscall
QtPrivate::BindableWarnings::printUnsuitableBindableWarning
          (BindableWarnings *this,QAnyStringView prefix,Reason reason)

{
  QDebug *pQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_60;
  undefined4 local_48;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined4 local_34;
  char *local_30;
  undefined1 local_28 [16];
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_18;
  char *local_10;
  
  local_18 = prefix.field_0;
  local_10 = *(char **)(in_FS_OFFSET + 0x28);
  local_28._8_8_ = this;
  lcQPropertyBinding();
  if ((int)prefix.m_size == 2) {
    if (((byte)lcQPropertyBinding::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
        == 0) goto LAB_00297b2d;
    local_48 = 2;
    local_44 = 0;
    uStack_3c = 0;
    local_34 = 0;
    local_30 = lcQPropertyBinding::category.name;
    QMessageLogger::warning((QMessageLogger *)local_28);
    *(bool *)(local_28._0_8_ + 0x31) = true;
    QAnyStringView::toString((QString *)&local_60,(QAnyStringView *)(local_28 + 8));
    pQVar1 = QDebug::operator<<((QDebug *)local_28,(QString *)&local_60);
    QDebug::operator<<(pQVar1,"The QBindable is read-only.");
  }
  else if ((int)prefix.m_size == 1) {
    if (((byte)lcQPropertyBinding::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
        == 0) goto LAB_00297b2d;
    local_48 = 2;
    local_44 = 0;
    uStack_3c = 0;
    local_34 = 0;
    local_30 = lcQPropertyBinding::category.name;
    QMessageLogger::warning((QMessageLogger *)local_28);
    *(bool *)(local_28._0_8_ + 0x31) = true;
    QAnyStringView::toString((QString *)&local_60,(QAnyStringView *)(local_28 + 8));
    pQVar1 = QDebug::operator<<((QDebug *)local_28,(QString *)&local_60);
    QDebug::operator<<(pQVar1,"The QBindable does not allow interaction with the binding.");
  }
  else {
    if (((byte)lcQPropertyBinding::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
        == 0) goto LAB_00297b2d;
    local_48 = 2;
    local_44 = 0;
    uStack_3c = 0;
    local_34 = 0;
    local_30 = lcQPropertyBinding::category.name;
    QMessageLogger::warning((QMessageLogger *)local_28);
    *(bool *)(local_28._0_8_ + 0x31) = true;
    QAnyStringView::toString((QString *)&local_60,(QAnyStringView *)(local_28 + 8));
    pQVar1 = QDebug::operator<<((QDebug *)local_28,(QString *)&local_60);
    QDebug::operator<<(pQVar1,"The QBindable is invalid.");
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QDebug::~QDebug((QDebug *)local_28);
LAB_00297b2d:
  if (*(char **)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void printUnsuitableBindableWarning(QAnyStringView prefix, BindableWarnings::Reason reason)
{
    switch (reason) {
    case QtPrivate::BindableWarnings::NonBindableInterface:
        qCWarning(lcQPropertyBinding).noquote() << prefix.toString()
                                                << "The QBindable does not allow interaction with the binding.";
        break;
    case QtPrivate::BindableWarnings::ReadOnlyInterface:
        qCWarning(lcQPropertyBinding).noquote() << prefix.toString()
                                                << "The QBindable is read-only.";
        break;
    default:
    case QtPrivate::BindableWarnings::InvalidInterface:
        qCWarning(lcQPropertyBinding).noquote() << prefix.toString()
                                                << "The QBindable is invalid.";
        break;
    }
}